

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O3

int dns_validate_request(char *req,size_t len)

{
  if ((((0xb < len) && ((*(ushort *)(req + 2) & 0x4080) == 0)) && (*(short *)(req + 4) != 0)) &&
     (*(short *)(req + 6) == 0)) {
    return 0;
  }
  return -1;
}

Assistant:

int dns_validate_request(const char * req, size_t len)
{
    struct dns_header_t * header = (struct dns_header_t *)req;
    if (len < sizeof(*header))
        return -1;

    if (header->qr == 0 /* query */
       && header->z == 0 /* Z is Zero */
       && ntohs(header->qdcount) /* some questions */
       && !ntohs(header->ancount)/* no answers */
       )
        return 0;
    return -1;
}